

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qktxhandler.cpp
# Opt level: O0

ssize_t __thiscall QKtxHandler::read(QKtxHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  initializer_list<unsigned_int> __l;
  QByteArrayView view;
  bool bVar1;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_bool> eVar2;
  uint uVar3;
  quint32 start;
  quint32 qVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  QIODevice *pQVar8;
  KTXHeader *header_00;
  char *pcVar9;
  qsizetype qVar10;
  const_pointer pvVar11;
  uint *puVar12;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  int face;
  quint32 imageSize;
  int level;
  quint32 offset;
  int maxLevels;
  quint32 bytesOfKeyValueData;
  size_t size;
  quint32 offsetNext;
  QByteArrayView imageSizeView;
  QByteArrayView keyValueDataView;
  quint32 headerKeyValueSize;
  QTextureFileData texData;
  QByteArray buf;
  uint dest;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_13;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_12;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_11;
  optional<unsigned_int> padded;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_10;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_9;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_8;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_7;
  optional<QMap<QByteArray,_QByteArray>_> keyValues;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  KTXHeader header;
  uint in_stack_fffffffffffffa58;
  quint32 in_stack_fffffffffffffa5c;
  undefined4 in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa64;
  undefined4 in_stack_fffffffffffffa68;
  Mode in_stack_fffffffffffffa6c;
  Mode mode;
  QTextureFileData *in_stack_fffffffffffffa70;
  QKtxHandler *this_00;
  quint32 local_570;
  quint32 qVar14;
  QKtxHandler *in_stack_fffffffffffffaa8;
  char local_4f0 [56];
  char local_4b8 [36];
  uint local_494 [7];
  char local_478 [56];
  char local_440 [48];
  QByteArrayView local_410 [2];
  char local_3e8 [56];
  char local_3b0 [56];
  char local_378 [32];
  qsizetype local_358;
  storage_type *local_350;
  char local_330 [16];
  QByteArrayView in_stack_fffffffffffffce0;
  qsizetype local_300;
  storage_type *local_2f8;
  char local_2d8 [56];
  char local_2a0 [36];
  uint local_27c [3];
  undefined1 *local_270;
  char local_250 [56];
  char local_218 [56];
  char local_1e0 [80];
  char local_190 [32];
  QByteArray local_170;
  undefined4 local_154;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  _Optional_payload_base<unsigned_int> local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined1 local_48 [36];
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  pQVar8 = ::QTextureFileHandler::device((QTextureFileHandler *)CONCAT44(in_register_00000034,__fd))
  ;
  if (pQVar8 == (QIODevice *)0x0) {
    QTextureFileData::QTextureFileData(in_stack_fffffffffffffa70,in_stack_fffffffffffffa6c);
    goto LAB_008bc5a8;
  }
  local_170.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_170.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_170.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  ::QTextureFileHandler::device((QTextureFileHandler *)CONCAT44(in_register_00000034,__fd));
  QIODevice::readAll();
  header_00 = (KTXHeader *)QByteArray::size(&local_170);
  uVar3 = std::numeric_limits<unsigned_int>::max();
  if ((KTXHeader *)(ulong)uVar3 < header_00) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQtGuiTextureIO();
    anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_68), bVar1) {
      anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bb3ac);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)header_00,
                 (char *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                 in_stack_fffffffffffffa64,
                 (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                 (char *)0x8bb3c5);
      ::QTextureFileHandler::logName
                ((QTextureFileHandler *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      pcVar9 = QByteArray::constData((QByteArray *)0x8bb3e4);
      QMessageLogger::warning(local_190,"Too big KTX file %s",pcVar9);
      QByteArray::~QByteArray((QByteArray *)0x8bb40a);
      local_60 = (undefined1 *)((ulong)local_60 & 0xffffffffffffff00);
    }
    QTextureFileData::QTextureFileData((QTextureFileData *)header_00,in_stack_fffffffffffffa6c);
  }
  else {
    QByteArray::QByteArray((QByteArray *)0x8bb43d);
    bVar1 = canRead((QByteArray *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                    (QByteArray *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    mode = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa6c) ^ 0xff000000;
    QByteArray::~QByteArray((QByteArray *)0x8bb465);
    if ((mode & 0x1000000) == ByteArrayMode) {
      qVar10 = QByteArray::size(&local_170);
      if (qVar10 < 0x40) {
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcQtGuiTextureIO();
        anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                   CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_88), bVar1) {
          anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bb5b3);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)header_00,(char *)CONCAT44(mode,in_stack_fffffffffffffa68),
                     in_stack_fffffffffffffa64,
                     (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                     (char *)0x8bb5cc);
          ::QTextureFileHandler::logName
                    ((QTextureFileHandler *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
          pcVar9 = QByteArray::constData((QByteArray *)0x8bb5eb);
          QMessageLogger::warning(local_218,"Invalid KTX header size in %s",pcVar9);
          QByteArray::~QByteArray((QByteArray *)0x8bb611);
          local_80 = (undefined1 *)((ulong)local_80 & 0xffffffffffffff00);
        }
        QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
      }
      else {
        memset(local_48,0xaa,0x40);
        pcVar9 = QByteArray::data((QByteArray *)
                                  CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
        memcpy(local_48,pcVar9,0x40);
        bVar1 = checkHeader(this_00,header_00);
        if (bVar1) {
          local_270 = &DAT_aaaaaaaaaaaaaaaa;
          QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
          QTextureFileData::setData
                    ((QTextureFileData *)
                     CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
          start = decode((QKtxHandler *)
                         CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                         in_stack_fffffffffffffa5c);
          decode((QKtxHandler *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 in_stack_fffffffffffffa5c);
          QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                       in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58);
          QTextureFileData::setSize((QTextureFileData *)header_00,(QSize *)CONCAT44(mode,start));
          decode((QKtxHandler *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 in_stack_fffffffffffffa5c);
          QTextureFileData::setGLFormat((QTextureFileData *)header_00,mode);
          decode((QKtxHandler *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 in_stack_fffffffffffffa5c);
          QTextureFileData::setGLInternalFormat((QTextureFileData *)header_00,mode);
          decode((QKtxHandler *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 in_stack_fffffffffffffa5c);
          QTextureFileData::setGLBaseInternalFormat((QTextureFileData *)header_00,mode);
          decode((QKtxHandler *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 in_stack_fffffffffffffa5c);
          QTextureFileData::setNumLevels((QTextureFileData *)header_00,mode);
          decode((QKtxHandler *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 in_stack_fffffffffffffa5c);
          QTextureFileData::setNumFaces((QTextureFileData *)header_00,mode);
          qVar4 = decode((QKtxHandler *)
                         CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                         in_stack_fffffffffffffa5c);
          local_27c[0] = 0xaaaaaaaa;
          eVar2 = qAddOverflow<unsigned_int>(0x40,qVar4,local_27c);
          if (eVar2) {
            local_a8 = &DAT_aaaaaaaaaaaaaaaa;
            local_a0 = &DAT_aaaaaaaaaaaaaaaa;
            QtPrivateLogging::lcQtGuiTextureIO();
            anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                       CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                       (QLoggingCategory *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
            while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_a8), bVar1) {
              anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bb914);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),
                         in_stack_fffffffffffffa64,
                         (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                         (char *)0x8bb92d);
              ::QTextureFileHandler::logName
                        ((QTextureFileHandler *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
              pcVar9 = QByteArray::constData((QByteArray *)0x8bb94c);
              QMessageLogger::warning
                        (local_2a0,"Overflow in size of key value data in header of KTX file %s",
                         pcVar9);
              QByteArray::~QByteArray((QByteArray *)0x8bb972);
              local_a0 = (undefined1 *)((ulong)local_a0 & 0xffffffffffffff00);
            }
            QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
          }
          else {
            uVar3 = local_27c[0];
            qVar10 = QByteArray::size(&local_170);
            if (uVar3 < (uint)qVar10) {
              if (qVar4 == 0) {
LAB_008bbd7a:
                local_54 = local_24;
                local_50 = local_20;
                local_4c = local_1c;
                __l._M_len = (size_type)this_00;
                __l._M_array = (iterator)header_00;
                uVar5 = std::max<unsigned_int>(__l);
                uVar6 = qCountLeadingZeroBits(uVar5);
                iVar7 = QTextureFileData::numLevels
                                  ((QTextureFileData *)CONCAT44(uVar3,in_stack_fffffffffffffa60));
                if ((int)(0x20 - uVar6) < iVar7) {
                  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
                  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
                  QtPrivateLogging::lcQtGuiTextureIO();
                  anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                  QLoggingCategoryMacroHolder
                            ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                             CONCAT44(uVar3,in_stack_fffffffffffffa60),
                             (QLoggingCategory *)
                             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                 operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_f8),
                        bVar1) {
                    anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bbe4a);
                    QMessageLogger::QMessageLogger
                              ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),uVar3,
                               (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                               ,(char *)0x8bbe63);
                    ::QTextureFileHandler::logName
                              ((QTextureFileHandler *)
                               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                    pcVar9 = QByteArray::constData((QByteArray *)0x8bbe82);
                    QMessageLogger::warning(local_3b0,"Too many levels in KTX file %s",pcVar9);
                    QByteArray::~QByteArray((QByteArray *)0x8bbea8);
                    local_f0 = (undefined1 *)((ulong)local_f0 & 0xffffffffffffff00);
                  }
                  QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
                }
                else {
                  iVar7 = QTextureFileData::numFaces
                                    ((QTextureFileData *)CONCAT44(uVar3,in_stack_fffffffffffffa60));
                  if ((iVar7 == 1) ||
                     (iVar7 = QTextureFileData::numFaces
                                        ((QTextureFileData *)
                                         CONCAT44(uVar3,in_stack_fffffffffffffa60)), iVar7 == 6)) {
                    qVar4 = 0;
                    uVar5 = local_27c[0];
LAB_008bbfe4:
                    qVar14 = qVar4;
                    iVar7 = QTextureFileData::numLevels((QTextureFileData *)CONCAT44(uVar3,qVar4));
                    if ((int)qVar4 < iVar7) {
                      local_410[0].m_data = &DAT_aaaaaaaaaaaaaaaa;
                      local_410[0].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                      QByteArrayView::QByteArrayView<QByteArray,_true>
                                ((QByteArrayView *)header_00,(QByteArray *)CONCAT44(mode,start));
                      view.m_data = (storage_type *)this_00;
                      view.m_size = (qsizetype)header_00;
                      local_410[0] = safeView(view,start,uVar3);
                      bVar1 = QByteArrayView::isEmpty((QByteArrayView *)0x8bc075);
                      if (!bVar1) goto LAB_008bc155;
                      local_118 = &DAT_aaaaaaaaaaaaaaaa;
                      local_110 = &DAT_aaaaaaaaaaaaaaaa;
                      QtPrivateLogging::lcQtGuiTextureIO();
                      anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                      QLoggingCategoryMacroHolder
                                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)CONCAT44(uVar3,qVar4),
                                 (QLoggingCategory *)
                                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                     operator_cast_to_bool
                                               ((QLoggingCategoryMacroHolder *)&local_118), bVar1) {
                        anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bc0d1);
                        QMessageLogger::QMessageLogger
                                  ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),uVar3,
                                   (char *)CONCAT44(in_stack_fffffffffffffa5c,
                                                    in_stack_fffffffffffffa58),(char *)0x8bc0ea);
                        ::QTextureFileHandler::logName
                                  ((QTextureFileHandler *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                        pcVar9 = QByteArray::constData((QByteArray *)0x8bc109);
                        QMessageLogger::warning(local_440,"OOB request in KTX file %s",pcVar9);
                        QByteArray::~QByteArray((QByteArray *)0x8bc12f);
                        local_110 = (undefined1 *)((ulong)local_110 & 0xffffffffffffff00);
                      }
                      QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
                    }
                    else {
                      bVar1 = QTextureFileData::isValid((QTextureFileData *)CONCAT44(uVar5,qVar14));
                      if (bVar1) {
                        ::QTextureFileHandler::logName
                                  ((QTextureFileHandler *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                        QTextureFileData::setLogName
                                  ((QTextureFileData *)header_00,(QByteArray *)CONCAT44(mode,start))
                        ;
                        QByteArray::~QByteArray((QByteArray *)0x8bc574);
                        QTextureFileData::QTextureFileData
                                  ((QTextureFileData *)CONCAT44(uVar3,qVar4),
                                   (QTextureFileData *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                      }
                      else {
                        local_150 = &DAT_aaaaaaaaaaaaaaaa;
                        local_148 = &DAT_aaaaaaaaaaaaaaaa;
                        QtPrivateLogging::lcQtGuiTextureIO();
                        anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                        QLoggingCategoryMacroHolder
                                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                                   CONCAT44(uVar3,qVar4),
                                   (QLoggingCategory *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                       operator_cast_to_bool
                                                 ((QLoggingCategoryMacroHolder *)&local_150), bVar1)
                        {
                          anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                          name((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bc4bf);
                          QMessageLogger::QMessageLogger
                                    ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),uVar3,
                                     (char *)CONCAT44(in_stack_fffffffffffffa5c,
                                                      in_stack_fffffffffffffa58),(char *)0x8bc4d8);
                          ::QTextureFileHandler::logName
                                    ((QTextureFileHandler *)
                                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                          pcVar9 = QByteArray::constData((QByteArray *)0x8bc4f7);
                          QMessageLogger::warning
                                    (local_4f0,"Invalid values in header of KTX file %s",pcVar9);
                          QByteArray::~QByteArray((QByteArray *)0x8bc51d);
                          local_148 = (undefined1 *)((ulong)local_148 & 0xffffffffffffff00);
                        }
                        QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
                      }
                    }
                    goto LAB_008bc58e;
                  }
                  local_108 = &DAT_aaaaaaaaaaaaaaaa;
                  local_100 = &DAT_aaaaaaaaaaaaaaaa;
                  QtPrivateLogging::lcQtGuiTextureIO();
                  anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                  QLoggingCategoryMacroHolder
                            ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                             CONCAT44(uVar3,in_stack_fffffffffffffa60),
                             (QLoggingCategory *)
                             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                 operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_108),
                        bVar1) {
                    anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bbf4d);
                    QMessageLogger::QMessageLogger
                              ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),uVar3,
                               (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                               ,(char *)0x8bbf66);
                    ::QTextureFileHandler::logName
                              ((QTextureFileHandler *)
                               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                    pcVar9 = QByteArray::constData((QByteArray *)0x8bbf85);
                    QMessageLogger::warning
                              (local_3e8,"Invalid number of faces in KTX file %s",pcVar9);
                    QByteArray::~QByteArray((QByteArray *)0x8bbfab);
                    local_100 = (undefined1 *)((ulong)local_100 & 0xffffffffffffff00);
                  }
                  QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
                }
              }
              else {
                QByteArrayView::QByteArrayView<QByteArray,_true>
                          ((QByteArrayView *)header_00,(QByteArray *)CONCAT44(mode,start));
                QVar13.m_data = (storage_type *)this_00;
                QVar13.m_size = (qsizetype)header_00;
                QVar13 = safeView(QVar13,start,uVar3);
                bVar1 = QByteArrayView::isEmpty((QByteArrayView *)0x8bbb0f);
                if (bVar1) {
                  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
                  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
                  QtPrivateLogging::lcQtGuiTextureIO();
                  anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                  QLoggingCategoryMacroHolder
                            ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                             CONCAT44(uVar3,in_stack_fffffffffffffa60),
                             (QLoggingCategory *)
                             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                 operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_c8),
                        bVar1) {
                    anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bbb6b);
                    QMessageLogger::QMessageLogger
                              ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),uVar3,
                               (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                               ,(char *)0x8bbb84);
                    ::QTextureFileHandler::logName
                              ((QTextureFileHandler *)
                               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                    pcVar9 = QByteArray::constData((QByteArray *)0x8bbba3);
                    QMessageLogger::warning(local_330,"Invalid view in KTX file %s",pcVar9);
                    QByteArray::~QByteArray((QByteArray *)0x8bbbc9);
                    local_c0 = (undefined1 *)((ulong)local_c0 & 0xffffffffffffff00);
                  }
                  QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
                }
                else {
                  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
                  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
                  local_300 = QVar13.m_size;
                  local_358 = local_300;
                  local_2f8 = QVar13.m_data;
                  local_350 = local_2f8;
                  decodeKeyValues(in_stack_fffffffffffffaa8,in_stack_fffffffffffffce0);
                  bVar1 = std::optional::operator_cast_to_bool
                                    ((optional<QMap<QByteArray,_QByteArray>_> *)0x8bbc5c);
                  if (bVar1) {
                    std::optional<QMap<QByteArray,_QByteArray>_>::operator*
                              ((optional<QMap<QByteArray,_QByteArray>_> *)0x8bbd45);
                    QTextureFileData::setKeyValueMetadata
                              ((QTextureFileData *)header_00,
                               (QMap<QByteArray,_QByteArray> *)CONCAT44(mode,start));
                    bVar1 = false;
                  }
                  else {
                    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
                    local_e0 = &DAT_aaaaaaaaaaaaaaaa;
                    QtPrivateLogging::lcQtGuiTextureIO();
                    anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                    QLoggingCategoryMacroHolder
                              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                               CONCAT44(uVar3,in_stack_fffffffffffffa60),
                               (QLoggingCategory *)
                               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                   operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_e8),
                          bVar1) {
                      anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bbcb7);
                      QMessageLogger::QMessageLogger
                                ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),uVar3,
                                 (char *)CONCAT44(in_stack_fffffffffffffa5c,
                                                  in_stack_fffffffffffffa58),(char *)0x8bbcd0);
                      ::QTextureFileHandler::logName
                                ((QTextureFileHandler *)
                                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                      pcVar9 = QByteArray::constData((QByteArray *)0x8bbcef);
                      QMessageLogger::warning
                                (local_378,"Could not parse key values in KTX file %s",pcVar9);
                      QByteArray::~QByteArray((QByteArray *)0x8bbd15);
                      local_e0 = (undefined1 *)((ulong)local_e0 & 0xffffffffffffff00);
                    }
                    QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
                    bVar1 = true;
                  }
                  std::optional<QMap<QByteArray,_QByteArray>_>::~optional
                            ((optional<QMap<QByteArray,_QByteArray>_> *)0x8bbd6a);
                  if (!bVar1) goto LAB_008bbd7a;
                }
              }
            }
            else {
              local_b8 = &DAT_aaaaaaaaaaaaaaaa;
              local_b0 = &DAT_aaaaaaaaaaaaaaaa;
              QtPrivateLogging::lcQtGuiTextureIO();
              anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
              QLoggingCategoryMacroHolder
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                         CONCAT44(uVar3,in_stack_fffffffffffffa60),
                         (QLoggingCategory *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
              while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                             operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_b8), bVar1)
              {
                anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                          ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bba12);
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),uVar3,
                           (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                           (char *)0x8bba2b);
                ::QTextureFileHandler::logName
                          ((QTextureFileHandler *)
                           CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                pcVar9 = QByteArray::constData((QByteArray *)0x8bba4a);
                QMessageLogger::warning(local_2d8,"OOB request in KTX file %s",pcVar9);
                QByteArray::~QByteArray((QByteArray *)0x8bba70);
                local_b0 = (undefined1 *)((ulong)local_b0 & 0xffffffffffffff00);
              }
              QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
            }
          }
LAB_008bc58e:
          QTextureFileData::~QTextureFileData((QTextureFileData *)0x8bc59b);
        }
        else {
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          local_90 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcQtGuiTextureIO();
          anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                     CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                     (QLoggingCategory *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_98), bVar1) {
            anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bb6dd);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)header_00,(char *)CONCAT44(mode,in_stack_fffffffffffffa68),
                       in_stack_fffffffffffffa64,
                       (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                       (char *)0x8bb6f6);
            ::QTextureFileHandler::logName
                      ((QTextureFileHandler *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
            pcVar9 = QByteArray::constData((QByteArray *)0x8bb715);
            QMessageLogger::warning(local_250,"Unsupported KTX file format in %s",pcVar9);
            QByteArray::~QByteArray((QByteArray *)0x8bb73b);
            local_90 = (undefined1 *)((ulong)local_90 & 0xffffffffffffff00);
          }
          QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
        }
      }
    }
    else {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQtGuiTextureIO();
      anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_78), bVar1) {
        anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bb4c5);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)header_00,(char *)CONCAT44(mode,in_stack_fffffffffffffa68),
                   in_stack_fffffffffffffa64,
                   (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                   (char *)0x8bb4de);
        ::QTextureFileHandler::logName
                  ((QTextureFileHandler *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        pcVar9 = QByteArray::constData((QByteArray *)0x8bb4fd);
        QMessageLogger::warning(local_1e0,"Invalid KTX file %s",pcVar9);
        QByteArray::~QByteArray((QByteArray *)0x8bb523);
        local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
      }
      QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x8bc5a8);
LAB_008bc5a8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (ssize_t)this;
LAB_008bc155:
  pvVar11 = QByteArrayView::data(local_410);
  local_154 = *(undefined4 *)pvVar11;
  decode((QKtxHandler *)CONCAT44(uVar3,qVar4),in_stack_fffffffffffffa5c);
  local_570 = 0;
  uVar5 = uVar5 + 4;
  while (in_stack_fffffffffffffa5c = local_570,
        iVar7 = QTextureFileData::numFaces((QTextureFileData *)CONCAT44(uVar3,qVar4)),
        (int)in_stack_fffffffffffffa5c < iVar7) {
    QTextureFileData::setDataOffset((QTextureFileData *)header_00,mode,start,uVar3);
    QTextureFileData::setDataLength((QTextureFileData *)header_00,mode,start,uVar3);
    local_120 = (_Optional_payload_base<unsigned_int>)&DAT_aaaaaaaaaaaaaaaa;
    local_120 = (_Optional_payload_base<unsigned_int>)nearestMultipleOf4(qVar4);
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x8bc23a);
    if (!bVar1) {
      local_130 = &DAT_aaaaaaaaaaaaaaaa;
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQtGuiTextureIO();
      anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)CONCAT44(uVar3,qVar4),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_130), bVar1) {
        anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bc295);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),uVar3,
                   (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                   (char *)0x8bc2ae);
        ::QTextureFileHandler::logName
                  ((QTextureFileHandler *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        pcVar9 = QByteArray::constData((QByteArray *)0x8bc2cd);
        QMessageLogger::warning(local_478,"Overflow in KTX file %s",pcVar9);
        QByteArray::~QByteArray((QByteArray *)0x8bc2f3);
        local_128 = (undefined1 *)((ulong)local_128 & 0xffffffffffffff00);
      }
      QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
      goto LAB_008bc58e;
    }
    local_494[0] = 0xaaaaaaaa;
    puVar12 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x8bc338);
    eVar2 = qAddOverflow<unsigned_int>(uVar5,*puVar12,local_494);
    if (eVar2) {
      local_140 = &DAT_aaaaaaaaaaaaaaaa;
      local_138 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQtGuiTextureIO();
      anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)CONCAT44(uVar3,qVar4),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffa5c,uVar5));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_140), bVar1) {
        anon_unknown.dwarf_160d798::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x8bc3a6);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)header_00,(char *)CONCAT44(mode,start),uVar3,
                   (char *)CONCAT44(in_stack_fffffffffffffa5c,uVar5),(char *)0x8bc3bf);
        ::QTextureFileHandler::logName
                  ((QTextureFileHandler *)CONCAT44(in_stack_fffffffffffffa5c,uVar5));
        pcVar9 = QByteArray::constData((QByteArray *)0x8bc3de);
        QMessageLogger::warning(local_4b8,"OOB request in KTX file %s",pcVar9);
        QByteArray::~QByteArray((QByteArray *)0x8bc404);
        local_138 = (undefined1 *)((ulong)local_138 & 0xffffffffffffff00);
      }
      QTextureFileData::QTextureFileData((QTextureFileData *)header_00,mode);
      goto LAB_008bc58e;
    }
    local_570 = local_570 + 1;
    in_stack_fffffffffffffa58 = uVar5;
    uVar5 = local_494[0];
  }
  qVar4 = qVar14 + 1;
  goto LAB_008bbfe4;
}

Assistant:

QTextureFileData QKtxHandler::read()
{
    if (!device())
        return QTextureFileData();

    const QByteArray buf = device()->readAll();
    if (static_cast<size_t>(buf.size()) > std::numeric_limits<quint32>::max()) {
        qCWarning(lcQtGuiTextureIO, "Too big KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (!canRead(QByteArray(), buf)) {
        qCWarning(lcQtGuiTextureIO, "Invalid KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (buf.size() < qsizetype(qktxh_headerSize)) {
        qCWarning(lcQtGuiTextureIO, "Invalid KTX header size in %s", logName().constData());
        return QTextureFileData();
    }

    KTXHeader header;
    memcpy(&header, buf.data(), qktxh_headerSize);
    if (!checkHeader(header)) {
        qCWarning(lcQtGuiTextureIO, "Unsupported KTX file format in %s", logName().constData());
        return QTextureFileData();
    }

    QTextureFileData texData;
    texData.setData(buf);

    texData.setSize(QSize(decode(header.pixelWidth), decode(header.pixelHeight)));
    texData.setGLFormat(decode(header.glFormat));
    texData.setGLInternalFormat(decode(header.glInternalFormat));
    texData.setGLBaseInternalFormat(decode(header.glBaseInternalFormat));

    texData.setNumLevels(decode(header.numberOfMipmapLevels));
    texData.setNumFaces(decode(header.numberOfFaces));

    const quint32 bytesOfKeyValueData = decode(header.bytesOfKeyValueData);
    quint32 headerKeyValueSize;
    if (qAddOverflow(qktxh_headerSize, bytesOfKeyValueData, &headerKeyValueSize)) {
        qCWarning(lcQtGuiTextureIO, "Overflow in size of key value data in header of KTX file %s",
                 logName().constData());
        return QTextureFileData();
    }

    if (headerKeyValueSize >= quint32(buf.size())) {
        qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    // File contains key/values
    if (bytesOfKeyValueData > 0) {
        auto keyValueDataView = safeView(buf, qktxh_headerSize, bytesOfKeyValueData);
        if (keyValueDataView.isEmpty()) {
            qCWarning(lcQtGuiTextureIO, "Invalid view in KTX file %s", logName().constData());
            return QTextureFileData();
        }

        auto keyValues = decodeKeyValues(keyValueDataView);
        if (!keyValues) {
            qCWarning(lcQtGuiTextureIO, "Could not parse key values in KTX file %s",
                     logName().constData());
            return QTextureFileData();
        }

        texData.setKeyValueMetadata(*keyValues);
    }

    // Technically, any number of levels is allowed but if the value is bigger than
    // what is possible in KTX V2 (and what makes sense) we return an error.
    // maxLevels = log2(max(width, height, depth))
    const int maxLevels = (sizeof(quint32) * 8)
            - qCountLeadingZeroBits(std::max(
                    { header.pixelWidth, header.pixelHeight, header.pixelDepth }));

    if (texData.numLevels() > maxLevels) {
        qCWarning(lcQtGuiTextureIO, "Too many levels in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (texData.numFaces() != 1 && texData.numFaces() != 6) {
        qCWarning(lcQtGuiTextureIO, "Invalid number of faces in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    quint32 offset = headerKeyValueSize;
    for (int level = 0; level < texData.numLevels(); level++) {
        const auto imageSizeView = safeView(buf, offset, sizeof(quint32));
        if (imageSizeView.isEmpty()) {
            qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
            return QTextureFileData();
        }

        const quint32 imageSize = decode(qFromUnaligned<quint32>(imageSizeView.data()));
        offset += sizeof(quint32); // overflow checked indirectly above

        for (int face = 0; face < texData.numFaces(); face++) {
            texData.setDataOffset(offset, level, face);
            texData.setDataLength(imageSize, level, face);

            // Add image data and padding to offset
            const auto padded = nearestMultipleOf4(imageSize);
            if (!padded) {
                qCWarning(lcQtGuiTextureIO, "Overflow in KTX file %s", logName().constData());
                return QTextureFileData();
            }

            quint32 offsetNext;
            if (qAddOverflow(offset, *padded, &offsetNext)) {
                qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
                return QTextureFileData();
            }

            offset = offsetNext;
        }
    }

    if (!texData.isValid()) {
        qCWarning(lcQtGuiTextureIO, "Invalid values in header of KTX file %s",
                 logName().constData());
        return QTextureFileData();
    }

    texData.setLogName(logName());

#ifdef KTX_DEBUG
    qDebug() << "KTX file handler read" << texData;
#endif

    return texData;
}